

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool initExtensions(void)

{
  int iVar1;
  char name [32];
  XkbStateRec state;
  int supported;
  XRRScreenResources *sr;
  char *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  _XkbStateRec local_1e;
  int local_c;
  XRRScreenResources *local_8;
  
  _glfw.x11.vidmode.handle = _glfwPlatformLoadModule((char *)0xa3a0c0);
  if (_glfw.x11.vidmode.handle != (void *)0x0) {
    _glfw.x11.vidmode.QueryExtension =
         (PFN_XF86VidModeQueryExtension)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.vidmode.GetGammaRamp =
         (PFN_XF86VidModeGetGammaRamp)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.vidmode.SetGammaRamp =
         (PFN_XF86VidModeSetGammaRamp)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.vidmode.GetGammaRampSize =
         (PFN_XF86VidModeGetGammaRampSize)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.vidmode.available =
         (*_glfw.x11.vidmode.QueryExtension)
                   (_glfw.x11.display,&_glfw.x11.vidmode.eventBase,&_glfw.x11.vidmode.errorBase);
  }
  _glfw.x11.xi.handle = _glfwPlatformLoadModule((char *)0xa3a1eb);
  if (_glfw.x11.xi.handle != (void *)0x0) {
    _glfw.x11.xi.QueryVersion =
         (PFN_XIQueryVersion)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xi.SelectEvents =
         (PFN_XISelectEvents)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = (*_glfw.x11.xlib.QueryExtension)
                      (_glfw.x11.display,"XInputExtension",&_glfw.x11.xi.majorOpcode,
                       &_glfw.x11.xi.eventBase,&_glfw.x11.xi.errorBase);
    if (iVar1 != 0) {
      _glfw.x11.xi.major = 2;
      _glfw.x11.xi.minor = 0;
      iVar1 = (*_glfw.x11.xi.QueryVersion)
                        (_glfw.x11.display,&_glfw.x11.xi.major,&_glfw.x11.xi.minor);
      if (iVar1 == 0) {
        _glfw.x11.xi.available = 1;
      }
    }
  }
  _glfw.x11.randr.handle = _glfwPlatformLoadModule((char *)0xa3a33e);
  if (_glfw.x11.randr.handle != (void *)0x0) {
    _glfw.x11.randr.AllocGamma =
         (PFN_XRRAllocGamma)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.FreeGamma =
         (PFN_XRRFreeGamma)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.FreeCrtcInfo =
         (PFN_XRRFreeCrtcInfo)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.FreeGamma =
         (PFN_XRRFreeGamma)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.FreeOutputInfo =
         (PFN_XRRFreeOutputInfo)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.FreeScreenResources =
         (PFN_XRRFreeScreenResources)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetCrtcGamma =
         (PFN_XRRGetCrtcGamma)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetCrtcGammaSize =
         (PFN_XRRGetCrtcGammaSize)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetCrtcInfo =
         (PFN_XRRGetCrtcInfo)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetOutputInfo =
         (PFN_XRRGetOutputInfo)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetOutputPrimary =
         (PFN_XRRGetOutputPrimary)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.GetScreenResourcesCurrent =
         (PFN_XRRGetScreenResourcesCurrent)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.QueryExtension =
         (PFN_XRRQueryExtension)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.QueryVersion =
         (PFN_XRRQueryVersion)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.SelectInput =
         (PFN_XRRSelectInput)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.SetCrtcConfig =
         (PFN_XRRSetCrtcConfig)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.SetCrtcGamma =
         (PFN_XRRSetCrtcGamma)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.randr.UpdateConfiguration =
         (PFN_XRRUpdateConfiguration)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = (*_glfw.x11.randr.QueryExtension)
                      (_glfw.x11.display,&_glfw.x11.randr.eventBase,&_glfw.x11.randr.errorBase);
    if (iVar1 != 0) {
      iVar1 = (*_glfw.x11.randr.QueryVersion)
                        (_glfw.x11.display,&_glfw.x11.randr.major,&_glfw.x11.randr.minor);
      if (iVar1 == 0) {
        _glfwInputError(0x10008,"X11: Failed to query RandR version");
      }
      else if ((1 < _glfw.x11.randr.major) || (2 < _glfw.x11.randr.minor)) {
        _glfw.x11.randr.available = 1;
      }
    }
  }
  if (_glfw.x11.randr.available != 0) {
    local_8 = (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    if ((local_8->ncrtc == 0) ||
       (iVar1 = (*_glfw.x11.randr.GetCrtcGammaSize)(_glfw.x11.display,*local_8->crtcs), iVar1 == 0))
    {
      _glfw.x11.randr.gammaBroken = 1;
    }
    if (local_8->ncrtc == 0) {
      _glfw.x11.randr.monitorBroken = 1;
    }
    (*_glfw.x11.randr.FreeScreenResources)(local_8);
  }
  if ((_glfw.x11.randr.available != 0) && (_glfw.x11.randr.monitorBroken == 0)) {
    (*_glfw.x11.randr.SelectInput)(_glfw.x11.display,_glfw.x11.root,4);
  }
  _glfw.x11.xcursor.handle = _glfwPlatformLoadModule((char *)0xa3a85c);
  if (_glfw.x11.xcursor.handle != (void *)0x0) {
    _glfw.x11.xcursor.ImageCreate =
         (PFN_XcursorImageCreate)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xcursor.ImageDestroy =
         (PFN_XcursorImageDestroy)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xcursor.ImageLoadCursor =
         (PFN_XcursorImageLoadCursor)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xcursor.GetTheme =
         (PFN_XcursorGetTheme)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xcursor.GetDefaultSize =
         (PFN_XcursorGetDefaultSize)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xcursor.LibraryLoadImage =
         (PFN_XcursorLibraryLoadImage)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  _glfw.x11.xinerama.handle = _glfwPlatformLoadModule((char *)0xa3a990);
  if (_glfw.x11.xinerama.handle != (void *)0x0) {
    _glfw.x11.xinerama.IsActive =
         (PFN_XineramaIsActive)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xinerama.QueryExtension =
         (PFN_XineramaQueryExtension)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xinerama.QueryScreens =
         (PFN_XineramaQueryScreens)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = (*_glfw.x11.xinerama.QueryExtension)
                      (_glfw.x11.display,&_glfw.x11.xinerama.major,&_glfw.x11.xinerama.minor);
    if ((iVar1 != 0) && (iVar1 = (*_glfw.x11.xinerama.IsActive)(_glfw.x11.display), iVar1 != 0)) {
      _glfw.x11.xinerama.available = 1;
    }
  }
  _glfw.x11.xkb.major = 1;
  _glfw.x11.xkb.minor = 0;
  _glfw.x11.xkb.available =
       (*_glfw.x11.xkb.QueryExtension)
                 (_glfw.x11.display,&_glfw.x11.xkb.majorOpcode,&_glfw.x11.xkb.eventBase,
                  &_glfw.x11.xkb.errorBase,&_glfw.x11.xkb.major,&_glfw.x11.xkb.minor);
  if (_glfw.x11.xkb.available != 0) {
    iVar1 = (*_glfw.x11.xkb.SetDetectableAutoRepeat)(_glfw.x11.display,1,&local_c);
    if ((iVar1 != 0) && (local_c != 0)) {
      _glfw.x11.xkb.detectable = 1;
    }
    iVar1 = (*_glfw.x11.xkb.GetState)(_glfw.x11.display,0x100,&local_1e);
    if (iVar1 == 0) {
      _glfw.x11.xkb.group = (uint)local_1e.group;
    }
    (*_glfw.x11.xkb.SelectEventDetails)(_glfw.x11.display,0x100,2,0x10,0x10);
  }
  if (_glfw.hints.init.x11.xcbVulkanSurface != 0) {
    _glfw.x11.x11xcb.handle = _glfwPlatformLoadModule((char *)0xa3ac1d);
  }
  if (_glfw.x11.x11xcb.handle != (void *)0x0) {
    _glfw.x11.x11xcb.GetXCBConnection =
         (PFN_XGetXCBConnection)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  _glfw.x11.xrender.handle = _glfwPlatformLoadModule((char *)0xa3ac76);
  if (_glfw.x11.xrender.handle != (void *)0x0) {
    _glfw.x11.xrender.QueryExtension =
         (PFN_XRenderQueryExtension)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xrender.QueryVersion =
         (PFN_XRenderQueryVersion)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xrender.FindVisualFormat =
         (PFN_XRenderFindVisualFormat)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = (*_glfw.x11.xrender.QueryExtension)
                      (_glfw.x11.display,&_glfw.x11.xrender.errorBase,&_glfw.x11.xrender.eventBase);
    if ((iVar1 != 0) &&
       (iVar1 = (*_glfw.x11.xrender.QueryVersion)
                          (_glfw.x11.display,&_glfw.x11.xrender.major,&_glfw.x11.xrender.minor),
       iVar1 != 0)) {
      _glfw.x11.xrender.available = 1;
    }
  }
  _glfw.x11.xshape.handle = _glfwPlatformLoadModule((char *)0xa3adc4);
  if (_glfw.x11.xshape.handle != (void *)0x0) {
    _glfw.x11.xshape.QueryExtension =
         (PFN_XShapeQueryExtension)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xshape.ShapeCombineRegion =
         (PFN_XShapeCombineRegion)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xshape.QueryVersion =
         (PFN_XShapeQueryVersion)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    _glfw.x11.xshape.ShapeCombineMask =
         (PFN_XShapeCombineMask)
         _glfwPlatformGetModuleSymbol(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = (*_glfw.x11.xshape.QueryExtension)
                      (_glfw.x11.display,&_glfw.x11.xshape.errorBase,&_glfw.x11.xshape.eventBase);
    if ((iVar1 != 0) &&
       (iVar1 = (*_glfw.x11.xshape.QueryVersion)
                          (_glfw.x11.display,&_glfw.x11.xshape.major,&_glfw.x11.xshape.minor),
       iVar1 != 0)) {
      _glfw.x11.xshape.available = 1;
    }
  }
  createKeyTables();
  _glfw.x11.NULL_ = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"NULL",0);
  _glfw.x11.UTF8_STRING = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"UTF8_STRING",0);
  _glfw.x11.ATOM_PAIR = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"ATOM_PAIR",0);
  _glfw.x11.GLFW_SELECTION = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"GLFW_SELECTION",0);
  _glfw.x11.TARGETS = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"TARGETS",0);
  _glfw.x11.MULTIPLE = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"MULTIPLE",0);
  _glfw.x11.PRIMARY = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"PRIMARY",0);
  _glfw.x11.INCR = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"INCR",0);
  _glfw.x11.CLIPBOARD = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"CLIPBOARD",0);
  _glfw.x11.CLIPBOARD_MANAGER =
       (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"CLIPBOARD_MANAGER",0);
  _glfw.x11.SAVE_TARGETS = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"SAVE_TARGETS",0);
  _glfw.x11.XdndAware = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndAware",0);
  _glfw.x11.XdndEnter = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndEnter",0);
  _glfw.x11.XdndPosition = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndPosition",0);
  _glfw.x11.XdndStatus = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndStatus",0);
  _glfw.x11.XdndActionCopy = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndActionCopy",0);
  _glfw.x11.XdndDrop = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndDrop",0);
  _glfw.x11.XdndFinished = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndFinished",0);
  _glfw.x11.XdndSelection = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndSelection",0);
  _glfw.x11.XdndTypeList = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"XdndTypeList",0);
  _glfw.x11.text_uri_list = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"text/uri-list",0);
  _glfw.x11.WM_PROTOCOLS = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"WM_PROTOCOLS",0);
  _glfw.x11.WM_STATE = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"WM_STATE",0);
  _glfw.x11.WM_DELETE_WINDOW = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"WM_DELETE_WINDOW",0);
  _glfw.x11.NET_SUPPORTED = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_SUPPORTED",0);
  _glfw.x11.NET_SUPPORTING_WM_CHECK =
       (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_SUPPORTING_WM_CHECK",0);
  _glfw.x11.NET_WM_ICON = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_ICON",0);
  _glfw.x11.NET_WM_PING = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_PING",0);
  _glfw.x11.NET_WM_PID = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_PID",0);
  _glfw.x11.NET_WM_NAME = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_NAME",0);
  _glfw.x11.NET_WM_ICON_NAME = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_ICON_NAME",0)
  ;
  _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
       (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_BYPASS_COMPOSITOR",0);
  _glfw.x11.NET_WM_WINDOW_OPACITY =
       (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_NET_WM_WINDOW_OPACITY",0);
  _glfw.x11.MOTIF_WM_HINTS = (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,"_MOTIF_WM_HINTS",0);
  snprintf(&stack0xffffffffffffffb8,0x20,"_NET_WM_CM_S%u",(ulong)(uint)_glfw.x11.screen);
  _glfw.x11.NET_WM_CM_Sx =
       (*_glfw.x11.xlib.InternAtom)(_glfw.x11.display,&stack0xffffffffffffffb8,0);
  detectEWMH();
  return 1;
}

Assistant:

static GLFWbool initExtensions(void)
{
#if defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.vidmode.handle = _glfwPlatformLoadModule("libXxf86vm.so");
#else
    _glfw.x11.vidmode.handle = _glfwPlatformLoadModule("libXxf86vm.so.1");
#endif
    if (_glfw.x11.vidmode.handle)
    {
        _glfw.x11.vidmode.QueryExtension = (PFN_XF86VidModeQueryExtension)
            _glfwPlatformGetModuleSymbol(_glfw.x11.vidmode.handle, "XF86VidModeQueryExtension");
        _glfw.x11.vidmode.GetGammaRamp = (PFN_XF86VidModeGetGammaRamp)
            _glfwPlatformGetModuleSymbol(_glfw.x11.vidmode.handle, "XF86VidModeGetGammaRamp");
        _glfw.x11.vidmode.SetGammaRamp = (PFN_XF86VidModeSetGammaRamp)
            _glfwPlatformGetModuleSymbol(_glfw.x11.vidmode.handle, "XF86VidModeSetGammaRamp");
        _glfw.x11.vidmode.GetGammaRampSize = (PFN_XF86VidModeGetGammaRampSize)
            _glfwPlatformGetModuleSymbol(_glfw.x11.vidmode.handle, "XF86VidModeGetGammaRampSize");

        _glfw.x11.vidmode.available =
            XF86VidModeQueryExtension(_glfw.x11.display,
                                      &_glfw.x11.vidmode.eventBase,
                                      &_glfw.x11.vidmode.errorBase);
    }

#if defined(__CYGWIN__)
    _glfw.x11.xi.handle = _glfwPlatformLoadModule("libXi-6.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.xi.handle = _glfwPlatformLoadModule("libXi.so");
#else
    _glfw.x11.xi.handle = _glfwPlatformLoadModule("libXi.so.6");
#endif
    if (_glfw.x11.xi.handle)
    {
        _glfw.x11.xi.QueryVersion = (PFN_XIQueryVersion)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xi.handle, "XIQueryVersion");
        _glfw.x11.xi.SelectEvents = (PFN_XISelectEvents)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xi.handle, "XISelectEvents");

        if (XQueryExtension(_glfw.x11.display,
                            "XInputExtension",
                            &_glfw.x11.xi.majorOpcode,
                            &_glfw.x11.xi.eventBase,
                            &_glfw.x11.xi.errorBase))
        {
            _glfw.x11.xi.major = 2;
            _glfw.x11.xi.minor = 0;

            if (XIQueryVersion(_glfw.x11.display,
                               &_glfw.x11.xi.major,
                               &_glfw.x11.xi.minor) == Success)
            {
                _glfw.x11.xi.available = GLFW_TRUE;
            }
        }
    }

#if defined(__CYGWIN__)
    _glfw.x11.randr.handle = _glfwPlatformLoadModule("libXrandr-2.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.randr.handle = _glfwPlatformLoadModule("libXrandr.so");
#else
    _glfw.x11.randr.handle = _glfwPlatformLoadModule("libXrandr.so.2");
#endif
    if (_glfw.x11.randr.handle)
    {
        _glfw.x11.randr.AllocGamma = (PFN_XRRAllocGamma)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRAllocGamma");
        _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRFreeGamma");
        _glfw.x11.randr.FreeCrtcInfo = (PFN_XRRFreeCrtcInfo)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRFreeCrtcInfo");
        _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRFreeGamma");
        _glfw.x11.randr.FreeOutputInfo = (PFN_XRRFreeOutputInfo)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRFreeOutputInfo");
        _glfw.x11.randr.FreeScreenResources = (PFN_XRRFreeScreenResources)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRFreeScreenResources");
        _glfw.x11.randr.GetCrtcGamma = (PFN_XRRGetCrtcGamma)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetCrtcGamma");
        _glfw.x11.randr.GetCrtcGammaSize = (PFN_XRRGetCrtcGammaSize)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetCrtcGammaSize");
        _glfw.x11.randr.GetCrtcInfo = (PFN_XRRGetCrtcInfo)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetCrtcInfo");
        _glfw.x11.randr.GetOutputInfo = (PFN_XRRGetOutputInfo)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetOutputInfo");
        _glfw.x11.randr.GetOutputPrimary = (PFN_XRRGetOutputPrimary)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetOutputPrimary");
        _glfw.x11.randr.GetScreenResourcesCurrent = (PFN_XRRGetScreenResourcesCurrent)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRGetScreenResourcesCurrent");
        _glfw.x11.randr.QueryExtension = (PFN_XRRQueryExtension)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRQueryExtension");
        _glfw.x11.randr.QueryVersion = (PFN_XRRQueryVersion)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRQueryVersion");
        _glfw.x11.randr.SelectInput = (PFN_XRRSelectInput)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRSelectInput");
        _glfw.x11.randr.SetCrtcConfig = (PFN_XRRSetCrtcConfig)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRSetCrtcConfig");
        _glfw.x11.randr.SetCrtcGamma = (PFN_XRRSetCrtcGamma)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRSetCrtcGamma");
        _glfw.x11.randr.UpdateConfiguration = (PFN_XRRUpdateConfiguration)
            _glfwPlatformGetModuleSymbol(_glfw.x11.randr.handle, "XRRUpdateConfiguration");

        if (XRRQueryExtension(_glfw.x11.display,
                              &_glfw.x11.randr.eventBase,
                              &_glfw.x11.randr.errorBase))
        {
            if (XRRQueryVersion(_glfw.x11.display,
                                &_glfw.x11.randr.major,
                                &_glfw.x11.randr.minor))
            {
                // The GLFW RandR path requires at least version 1.3
                if (_glfw.x11.randr.major > 1 || _glfw.x11.randr.minor >= 3)
                    _glfw.x11.randr.available = GLFW_TRUE;
            }
            else
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "X11: Failed to query RandR version");
            }
        }
    }

    if (_glfw.x11.randr.available)
    {
        XRRScreenResources* sr = XRRGetScreenResourcesCurrent(_glfw.x11.display,
                                                              _glfw.x11.root);

        if (!sr->ncrtc || !XRRGetCrtcGammaSize(_glfw.x11.display, sr->crtcs[0]))
        {
            // This is likely an older Nvidia driver with broken gamma support
            // Flag it as useless and fall back to xf86vm gamma, if available
            _glfw.x11.randr.gammaBroken = GLFW_TRUE;
        }

        if (!sr->ncrtc)
        {
            // A system without CRTCs is likely a system with broken RandR
            // Disable the RandR monitor path and fall back to core functions
            _glfw.x11.randr.monitorBroken = GLFW_TRUE;
        }

        XRRFreeScreenResources(sr);
    }

    if (_glfw.x11.randr.available && !_glfw.x11.randr.monitorBroken)
    {
        XRRSelectInput(_glfw.x11.display, _glfw.x11.root,
                       RROutputChangeNotifyMask);
    }

#if defined(__CYGWIN__)
    _glfw.x11.xcursor.handle = _glfwPlatformLoadModule("libXcursor-1.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.xcursor.handle = _glfwPlatformLoadModule("libXcursor.so");
#else
    _glfw.x11.xcursor.handle = _glfwPlatformLoadModule("libXcursor.so.1");
#endif
    if (_glfw.x11.xcursor.handle)
    {
        _glfw.x11.xcursor.ImageCreate = (PFN_XcursorImageCreate)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorImageCreate");
        _glfw.x11.xcursor.ImageDestroy = (PFN_XcursorImageDestroy)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorImageDestroy");
        _glfw.x11.xcursor.ImageLoadCursor = (PFN_XcursorImageLoadCursor)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorImageLoadCursor");
        _glfw.x11.xcursor.GetTheme = (PFN_XcursorGetTheme)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorGetTheme");
        _glfw.x11.xcursor.GetDefaultSize = (PFN_XcursorGetDefaultSize)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorGetDefaultSize");
        _glfw.x11.xcursor.LibraryLoadImage = (PFN_XcursorLibraryLoadImage)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xcursor.handle, "XcursorLibraryLoadImage");
    }

#if defined(__CYGWIN__)
    _glfw.x11.xinerama.handle = _glfwPlatformLoadModule("libXinerama-1.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.xinerama.handle = _glfwPlatformLoadModule("libXinerama.so");
#else
    _glfw.x11.xinerama.handle = _glfwPlatformLoadModule("libXinerama.so.1");
#endif
    if (_glfw.x11.xinerama.handle)
    {
        _glfw.x11.xinerama.IsActive = (PFN_XineramaIsActive)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xinerama.handle, "XineramaIsActive");
        _glfw.x11.xinerama.QueryExtension = (PFN_XineramaQueryExtension)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xinerama.handle, "XineramaQueryExtension");
        _glfw.x11.xinerama.QueryScreens = (PFN_XineramaQueryScreens)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xinerama.handle, "XineramaQueryScreens");

        if (XineramaQueryExtension(_glfw.x11.display,
                                   &_glfw.x11.xinerama.major,
                                   &_glfw.x11.xinerama.minor))
        {
            if (XineramaIsActive(_glfw.x11.display))
                _glfw.x11.xinerama.available = GLFW_TRUE;
        }
    }

    _glfw.x11.xkb.major = 1;
    _glfw.x11.xkb.minor = 0;
    _glfw.x11.xkb.available =
        XkbQueryExtension(_glfw.x11.display,
                          &_glfw.x11.xkb.majorOpcode,
                          &_glfw.x11.xkb.eventBase,
                          &_glfw.x11.xkb.errorBase,
                          &_glfw.x11.xkb.major,
                          &_glfw.x11.xkb.minor);

    if (_glfw.x11.xkb.available)
    {
        Bool supported;

        if (XkbSetDetectableAutoRepeat(_glfw.x11.display, True, &supported))
        {
            if (supported)
                _glfw.x11.xkb.detectable = GLFW_TRUE;
        }

        XkbStateRec state;
        if (XkbGetState(_glfw.x11.display, XkbUseCoreKbd, &state) == Success)
            _glfw.x11.xkb.group = (unsigned int)state.group;

        XkbSelectEventDetails(_glfw.x11.display, XkbUseCoreKbd, XkbStateNotify,
                              XkbGroupStateMask, XkbGroupStateMask);
    }

    if (_glfw.hints.init.x11.xcbVulkanSurface)
    {
#if defined(__CYGWIN__)
        _glfw.x11.x11xcb.handle = _glfwPlatformLoadModule("libX11-xcb-1.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
        _glfw.x11.x11xcb.handle = _glfwPlatformLoadModule("libX11-xcb.so");
#else
        _glfw.x11.x11xcb.handle = _glfwPlatformLoadModule("libX11-xcb.so.1");
#endif
    }

    if (_glfw.x11.x11xcb.handle)
    {
        _glfw.x11.x11xcb.GetXCBConnection = (PFN_XGetXCBConnection)
            _glfwPlatformGetModuleSymbol(_glfw.x11.x11xcb.handle, "XGetXCBConnection");
    }

#if defined(__CYGWIN__)
    _glfw.x11.xrender.handle = _glfwPlatformLoadModule("libXrender-1.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.xrender.handle = _glfwPlatformLoadModule("libXrender.so");
#else
    _glfw.x11.xrender.handle = _glfwPlatformLoadModule("libXrender.so.1");
#endif
    if (_glfw.x11.xrender.handle)
    {
        _glfw.x11.xrender.QueryExtension = (PFN_XRenderQueryExtension)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xrender.handle, "XRenderQueryExtension");
        _glfw.x11.xrender.QueryVersion = (PFN_XRenderQueryVersion)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xrender.handle, "XRenderQueryVersion");
        _glfw.x11.xrender.FindVisualFormat = (PFN_XRenderFindVisualFormat)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xrender.handle, "XRenderFindVisualFormat");

        if (XRenderQueryExtension(_glfw.x11.display,
                                  &_glfw.x11.xrender.errorBase,
                                  &_glfw.x11.xrender.eventBase))
        {
            if (XRenderQueryVersion(_glfw.x11.display,
                                    &_glfw.x11.xrender.major,
                                    &_glfw.x11.xrender.minor))
            {
                _glfw.x11.xrender.available = GLFW_TRUE;
            }
        }
    }

#if defined(__CYGWIN__)
    _glfw.x11.xshape.handle = _glfwPlatformLoadModule("libXext-6.so");
#elif defined(__OpenBSD__) || defined(__NetBSD__)
    _glfw.x11.xshape.handle = _glfwPlatformLoadModule("libXext.so");
#else
    _glfw.x11.xshape.handle = _glfwPlatformLoadModule("libXext.so.6");
#endif
    if (_glfw.x11.xshape.handle)
    {
        _glfw.x11.xshape.QueryExtension = (PFN_XShapeQueryExtension)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xshape.handle, "XShapeQueryExtension");
        _glfw.x11.xshape.ShapeCombineRegion = (PFN_XShapeCombineRegion)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xshape.handle, "XShapeCombineRegion");
        _glfw.x11.xshape.QueryVersion = (PFN_XShapeQueryVersion)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xshape.handle, "XShapeQueryVersion");
        _glfw.x11.xshape.ShapeCombineMask = (PFN_XShapeCombineMask)
            _glfwPlatformGetModuleSymbol(_glfw.x11.xshape.handle, "XShapeCombineMask");

        if (XShapeQueryExtension(_glfw.x11.display,
            &_glfw.x11.xshape.errorBase,
            &_glfw.x11.xshape.eventBase))
        {
            if (XShapeQueryVersion(_glfw.x11.display,
                &_glfw.x11.xshape.major,
                &_glfw.x11.xshape.minor))
            {
                _glfw.x11.xshape.available = GLFW_TRUE;
            }
        }
    }

    // Update the key code LUT
    // FIXME: We should listen to XkbMapNotify events to track changes to
    // the keyboard mapping.
    createKeyTables();

    // String format atoms
    _glfw.x11.NULL_ = XInternAtom(_glfw.x11.display, "NULL", False);
    _glfw.x11.UTF8_STRING = XInternAtom(_glfw.x11.display, "UTF8_STRING", False);
    _glfw.x11.ATOM_PAIR = XInternAtom(_glfw.x11.display, "ATOM_PAIR", False);

    // Custom selection property atom
    _glfw.x11.GLFW_SELECTION =
        XInternAtom(_glfw.x11.display, "GLFW_SELECTION", False);

    // ICCCM standard clipboard atoms
    _glfw.x11.TARGETS = XInternAtom(_glfw.x11.display, "TARGETS", False);
    _glfw.x11.MULTIPLE = XInternAtom(_glfw.x11.display, "MULTIPLE", False);
    _glfw.x11.PRIMARY = XInternAtom(_glfw.x11.display, "PRIMARY", False);
    _glfw.x11.INCR = XInternAtom(_glfw.x11.display, "INCR", False);
    _glfw.x11.CLIPBOARD = XInternAtom(_glfw.x11.display, "CLIPBOARD", False);

    // Clipboard manager atoms
    _glfw.x11.CLIPBOARD_MANAGER =
        XInternAtom(_glfw.x11.display, "CLIPBOARD_MANAGER", False);
    _glfw.x11.SAVE_TARGETS =
        XInternAtom(_glfw.x11.display, "SAVE_TARGETS", False);

    // Xdnd (drag and drop) atoms
    _glfw.x11.XdndAware = XInternAtom(_glfw.x11.display, "XdndAware", False);
    _glfw.x11.XdndEnter = XInternAtom(_glfw.x11.display, "XdndEnter", False);
    _glfw.x11.XdndPosition = XInternAtom(_glfw.x11.display, "XdndPosition", False);
    _glfw.x11.XdndStatus = XInternAtom(_glfw.x11.display, "XdndStatus", False);
    _glfw.x11.XdndActionCopy = XInternAtom(_glfw.x11.display, "XdndActionCopy", False);
    _glfw.x11.XdndDrop = XInternAtom(_glfw.x11.display, "XdndDrop", False);
    _glfw.x11.XdndFinished = XInternAtom(_glfw.x11.display, "XdndFinished", False);
    _glfw.x11.XdndSelection = XInternAtom(_glfw.x11.display, "XdndSelection", False);
    _glfw.x11.XdndTypeList = XInternAtom(_glfw.x11.display, "XdndTypeList", False);
    _glfw.x11.text_uri_list = XInternAtom(_glfw.x11.display, "text/uri-list", False);

    // ICCCM, EWMH and Motif window property atoms
    // These can be set safely even without WM support
    // The EWMH atoms that require WM support are handled in detectEWMH
    _glfw.x11.WM_PROTOCOLS =
        XInternAtom(_glfw.x11.display, "WM_PROTOCOLS", False);
    _glfw.x11.WM_STATE =
        XInternAtom(_glfw.x11.display, "WM_STATE", False);
    _glfw.x11.WM_DELETE_WINDOW =
        XInternAtom(_glfw.x11.display, "WM_DELETE_WINDOW", False);
    _glfw.x11.NET_SUPPORTED =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTED", False);
    _glfw.x11.NET_SUPPORTING_WM_CHECK =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTING_WM_CHECK", False);
    _glfw.x11.NET_WM_ICON =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON", False);
    _glfw.x11.NET_WM_PING =
        XInternAtom(_glfw.x11.display, "_NET_WM_PING", False);
    _glfw.x11.NET_WM_PID =
        XInternAtom(_glfw.x11.display, "_NET_WM_PID", False);
    _glfw.x11.NET_WM_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_NAME", False);
    _glfw.x11.NET_WM_ICON_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON_NAME", False);
    _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
        XInternAtom(_glfw.x11.display, "_NET_WM_BYPASS_COMPOSITOR", False);
    _glfw.x11.NET_WM_WINDOW_OPACITY =
        XInternAtom(_glfw.x11.display, "_NET_WM_WINDOW_OPACITY", False);
    _glfw.x11.MOTIF_WM_HINTS =
        XInternAtom(_glfw.x11.display, "_MOTIF_WM_HINTS", False);

    // The compositing manager selection name contains the screen number
    {
        char name[32];
        snprintf(name, sizeof(name), "_NET_WM_CM_S%u", _glfw.x11.screen);
        _glfw.x11.NET_WM_CM_Sx = XInternAtom(_glfw.x11.display, name, False);
    }

    // Detect whether an EWMH-conformant window manager is running
    detectEWMH();

    return GLFW_TRUE;
}